

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>,4ul,phmap::NullMutex>const&>
::
UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::pair<phmap::priv::hash_internal::EnumClass_const,int>const&>*,std::vector<testing::Matcher<std::pair<phmap::priv::hash_internal::EnumClass_const,int>const&>,std::allocator<testing::Matcher<std::pair<phmap::priv::hash_internal::EnumClass_const,int>const&>>>>>
          (UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>,4ul,phmap::NullMutex>const&>
           *this,Flags matcher_flags,
          __normal_iterator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>_>
          first,__normal_iterator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>_>
                last)

{
  bool bVar1;
  testing *this_00;
  MatcherDescriberVec *this_01;
  Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&> *matcher;
  MatcherDescriberInterface *local_78;
  MatcherBase<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&> *local_70;
  Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&> *m;
  iterator __end0;
  iterator __begin0;
  vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>
  *__range3;
  Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&> local_40;
  Flags local_24;
  UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>,4ul,phmap::NullMutex>const&>
  *pUStack_20;
  Flags matcher_flags_local;
  UnorderedElementsAreMatcherImpl<const_phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_&>
  *this_local;
  __normal_iterator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>_>
  last_local;
  __normal_iterator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>_>
  first_local;
  
  local_24 = matcher_flags;
  pUStack_20 = this;
  this_local = (UnorderedElementsAreMatcherImpl<const_phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_&>
                *)last._M_current;
  last_local = first;
  MatcherInterface<const_phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_&>
  ::MatcherInterface((MatcherInterface<const_phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_&>
                      *)this);
  UnorderedElementsAreMatcherImplBase::UnorderedElementsAreMatcherImplBase
            ((UnorderedElementsAreMatcherImplBase *)(this + 8),local_24);
  *(undefined ***)this = &PTR__UnorderedElementsAreMatcherImpl_004946a8;
  std::
  vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>
  ::vector((vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>
            *)(this + 0x28));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_local,
                       (__normal_iterator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>_>
                        *)&this_local);
    if (!bVar1) break;
    this_00 = (testing *)
              __gnu_cxx::
              __normal_iterator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>_>
              ::operator*(&last_local);
    MatcherCast<std::pair<phmap::priv::hash_internal::EnumClass_const,int>const&,testing::Matcher<std::pair<phmap::priv::hash_internal::EnumClass_const,int>const&>>
              (&local_40,this_00,matcher);
    std::
    vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>
    ::push_back((vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>
                 *)(this + 0x28),&local_40);
    Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>::~Matcher
              (&local_40);
    __gnu_cxx::
    __normal_iterator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>_>
    ::operator++(&last_local);
  }
  __end0 = std::
           vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>
           ::begin((vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>
                    *)(this + 0x28));
  m = (Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&> *)
      std::
      vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>
      ::end((vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>
             *)(this + 0x28));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>_>
                                *)&m);
    if (!bVar1) break;
    local_70 = &__gnu_cxx::
                __normal_iterator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>_>
                ::operator*(&__end0)->
                super_MatcherBase<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>
    ;
    this_01 = UnorderedElementsAreMatcherImplBase::matcher_describers
                        ((UnorderedElementsAreMatcherImplBase *)(this + 8));
    local_78 = MatcherBase<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>::
               GetDescriber(local_70);
    std::
    vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
    ::push_back(this_01,&local_78);
    __gnu_cxx::
    __normal_iterator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_&>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

UnorderedElementsAreMatcherImpl(UnorderedMatcherRequire::Flags matcher_flags,
                                  InputIter first, InputIter last)
      : UnorderedElementsAreMatcherImplBase(matcher_flags) {
    for (; first != last; ++first) {
      matchers_.push_back(MatcherCast<const Element&>(*first));
    }
    for (const auto& m : matchers_) {
      matcher_describers().push_back(m.GetDescriber());
    }
  }